

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O1

void GEO::CmdLine::declare_arg(string *name,int default_value,string *description,ArgFlags flags)

{
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  long local_1a0;
  undefined8 local_198 [13];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 0x11;
  std::ostream::operator<<((ostream *)&local_1a0,default_value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  GEO::CmdLine::declare_arg((string *)name,ARG_INT,(string *)local_1c0,(string *)description,flags);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0]);
  }
  return;
}

Assistant:

inline void declare_arg(
            const std::string& name,
            int default_value,
            const std::string& description,
            ArgFlags flags = ARG_FLAGS_DEFAULT
        ) {
            declare_arg(
                name, ARG_INT, String::to_string(default_value),
                description, flags
            );
        }